

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSetCommand.cxx
# Opt level: O3

bool cmSetCommand(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *args,cmExecutionStatus *status)

{
  long lVar1;
  string *var;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__n;
  bool bVar2;
  bool bVar3;
  int iVar4;
  CacheEntryType CVar5;
  long *plVar6;
  cmState *this;
  cmValue cVar7;
  pointer pbVar8;
  long lVar9;
  size_type *psVar10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  uint uVar12;
  ulong uVar13;
  pointer pbVar14;
  uint uVar15;
  pointer pcVar16;
  bool bVar17;
  string_view separator;
  string_view value_00;
  basic_string_view<char,_std::char_traits<char>_> __str;
  string putEnvArg;
  string value;
  string currValue;
  CacheEntryType type;
  string local_d0;
  string local_b0;
  undefined1 local_90 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  var = (args->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_start;
  if (var == (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish) {
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_b0,"called with incorrect number of arguments","");
    std::__cxx11::string::_M_assign((string *)&status->Error);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,
                      CONCAT71(local_b0.field_2._M_allocated_capacity._1_7_,
                               local_b0.field_2._M_local_buf[0]) + 1);
    }
    return false;
  }
  local_b0._M_string_length = (size_type)(var->_M_dataplus)._M_p;
  local_b0._M_dataplus._M_p = (pointer)var->_M_string_length;
  __str._M_str = "ENV{";
  __str._M_len = 4;
  iVar4 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                    ((basic_string_view<char,_std::char_traits<char>_> *)&local_b0,0,4,__str);
  if ((iVar4 == 0) && (5 < var->_M_string_length)) {
    std::__cxx11::string::substr((ulong)&local_b0,(ulong)var);
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_d0,local_b0._M_dataplus._M_p,
               local_b0._M_string_length + local_b0._M_dataplus._M_p);
    std::__cxx11::string::append((char *)&local_d0);
    local_90._0_8_ = local_90 + 0x10;
    local_90._8_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_90[0x10] = '\0';
    bVar2 = cmsys::SystemTools::GetEnv(&local_b0,(string *)local_90);
    pbVar8 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    uVar13 = (long)(args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar8;
    if ((uVar13 < 0x21) ||
       (__n = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              pbVar8[1]._M_string_length,
       __n == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      if (bVar2) {
        cmsys::SystemTools::PutEnv(&local_d0);
      }
      goto LAB_00345978;
    }
    if (bVar2) {
      pcVar16 = pbVar8[1]._M_dataplus._M_p;
      if (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90._8_8_ !=
           __n) || (iVar4 = bcmp((void *)local_90._0_8_,pcVar16,(size_t)__n), iVar4 != 0))
      goto LAB_00345886;
    }
    else {
      pcVar16 = pbVar8[1]._M_dataplus._M_p;
LAB_00345886:
      std::__cxx11::string::_M_append((char *)&local_d0,(ulong)pcVar16);
      cmsys::SystemTools::PutEnv(&local_d0);
      pbVar8 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      uVar13 = (long)(args->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar8;
    }
    if (0x40 < uVar13) {
      std::operator+(&local_50,
                     "Only the first value argument is used when setting an environment variable.  Argument \'"
                     ,pbVar8 + 2);
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_50);
      paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(plVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar6 == paVar11) {
        local_60._M_allocated_capacity = paVar11->_M_allocated_capacity;
        local_60._8_8_ = plVar6[3];
        local_70._M_allocated_capacity = (size_type)&local_60;
      }
      else {
        local_60._M_allocated_capacity = paVar11->_M_allocated_capacity;
        local_70._M_allocated_capacity =
             (size_type)
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)*plVar6;
      }
      local_70._8_8_ = plVar6[1];
      *plVar6 = (long)paVar11;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      cmMakefile::IssueMessage(status->Makefile,AUTHOR_WARNING,(string *)&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_allocated_capacity != &local_60) {
        operator_delete((void *)local_70._M_allocated_capacity,local_60._M_allocated_capacity + 1);
      }
    }
LAB_00345978:
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90._0_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_90 + 0x10)) {
      operator_delete((void *)local_90._0_8_,CONCAT71(local_90._17_7_,local_90[0x10]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,
                      CONCAT71(local_b0.field_2._M_allocated_capacity._1_7_,
                               local_b0.field_2._M_local_buf[0]) + 1);
    }
    return true;
  }
  pbVar8 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar14 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  uVar13 = (long)pbVar14 - (long)pbVar8;
  if ((long)uVar13 >> 5 == 2) {
    iVar4 = std::__cxx11::string::compare((char *)(pbVar14 + -1));
    if (iVar4 == 0) {
      cmMakefile::RaiseScope(status->Makefile,var,(char *)0x0);
      return true;
    }
    pbVar8 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    pbVar14 = (args->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_finish;
    uVar13 = (long)pbVar14 - (long)pbVar8;
  }
  else if ((long)uVar13 >> 5 == 1) {
    cmMakefile::RemoveDefinition(status->Makefile,var);
    return true;
  }
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  local_b0._M_string_length = 0;
  local_b0.field_2._M_local_buf[0] = '\0';
  local_70._M_allocated_capacity._0_4_ = 3;
  if (uVar13 < 0x21) {
LAB_0034561b:
    bVar2 = false;
    uVar15 = 0;
LAB_0034561e:
    if ((ulong)((long)uVar13 >> 5) < 4) {
      bVar17 = false;
      bVar3 = false;
    }
    else {
      iVar4 = std::__cxx11::string::compare
                        ((char *)(pbVar8 + (((long)uVar13 >> 5) - (ulong)bVar2) + -3));
      bVar17 = iVar4 == 0;
      uVar12 = uVar15 + 3;
      if (!bVar17) {
        uVar12 = uVar15;
      }
      pbVar8 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      pbVar14 = (args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish;
      bVar3 = false;
      uVar15 = uVar12;
    }
  }
  else {
    iVar4 = std::__cxx11::string::compare((char *)(pbVar14 + -1));
    bVar2 = false;
    pbVar8 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    pbVar14 = (args->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_finish;
    if (iVar4 != 0) {
      uVar13 = (long)pbVar14 - (long)pbVar8;
      if (uVar13 < 0x81) goto LAB_0034561b;
      iVar4 = std::__cxx11::string::compare((char *)(pbVar14 + -1));
      bVar2 = iVar4 == 0;
      uVar15 = (uint)bVar2;
      pbVar8 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      pbVar14 = (args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish;
      uVar13 = (long)pbVar14 - (long)pbVar8;
      goto LAB_0034561e;
    }
    uVar15 = 1;
    bVar3 = true;
    bVar17 = false;
  }
  local_90._0_8_ = pbVar8 + 1;
  local_90._8_8_ = (long)pbVar14 - (ulong)(uVar15 << 5);
  separator._M_str = ";";
  separator._M_len = 1;
  cmJoin(&local_d0,(cmStringRange *)local_90,separator,(string_view)ZEXT816(0));
  std::__cxx11::string::operator=((string *)&local_b0,(string *)&local_d0);
  paVar11 = &local_d0.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != paVar11) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  if (bVar3) {
    bVar3 = true;
    cmMakefile::RaiseScope(status->Makefile,var,local_b0._M_dataplus._M_p);
  }
  else {
    iVar4 = std::__cxx11::string::compare
                      ((char *)((args->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_finish + -1));
    if (iVar4 != 0) {
      pbVar8 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      uVar13 = (long)(args->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar8;
      if (((uVar13 < 0x21) ||
          (iVar4 = std::__cxx11::string::compare((char *)((long)pbVar8 + (uVar13 - 0x40))),
          iVar4 != 0)) && (bVar2 != true || bVar17)) {
        if (bVar17) {
          pbVar8 = (args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          lVar9 = ((long)(args->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar8 >> 5) -
                  (ulong)bVar2;
          lVar1 = lVar9 + -2;
          bVar3 = cmState::StringToCacheEntryType
                            (pbVar8 + lVar1,(CacheEntryType *)&local_70._M_allocated_capacity);
          if (!bVar3) {
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_90,"implicitly converting \'",
                           (args->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start + lVar1);
            plVar6 = (long *)std::__cxx11::string::append(local_90);
            psVar10 = (size_type *)(plVar6 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar6 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar10) {
              local_d0.field_2._M_allocated_capacity = *psVar10;
              local_d0.field_2._8_8_ = plVar6[3];
              local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
            }
            else {
              local_d0.field_2._M_allocated_capacity = *psVar10;
              local_d0._M_dataplus._M_p = (pointer)*plVar6;
            }
            local_d0._M_string_length = plVar6[1];
            *plVar6 = (long)psVar10;
            plVar6[1] = 0;
            *(undefined1 *)(plVar6 + 2) = 0;
            if ((pointer)local_90._0_8_ != (pointer)(local_90 + 0x10)) {
              operator_delete((void *)local_90._0_8_,CONCAT71(local_90._17_7_,local_90[0x10]) + 1);
            }
            cmMakefile::IssueMessage(status->Makefile,AUTHOR_WARNING,&local_d0);
            local_70._M_allocated_capacity._0_4_ = 3;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
              operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
            }
          }
          pcVar16 = (args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start[lVar9 + -1]._M_dataplus._M_p;
        }
        else {
          pcVar16 = (char *)0x0;
        }
        this = cmMakefile::GetState(status->Makefile);
        cVar7 = cmState::GetCacheEntryValue(this,var);
        if (((cVar7.Value == (string *)0x0) ||
            (CVar5 = cmState::GetCacheEntryType(this,var), CVar5 == UNINITIALIZED)) ||
           ((!bVar17 ||
            ((local_70._M_allocated_capacity._0_4_ == 4 || (bVar3 = true, bVar2 != false)))))) {
          if (bVar17) {
            bVar3 = true;
            cmMakefile::AddCacheDefinition
                      (status->Makefile,var,local_b0._M_dataplus._M_p,pcVar16,
                       local_70._M_allocated_capacity._0_4_,bVar2);
          }
          else {
            bVar3 = true;
            value_00._M_str = local_b0._M_dataplus._M_p;
            value_00._M_len = local_b0._M_string_length;
            cmMakefile::AddDefinition(status->Makefile,var,value_00);
          }
        }
        goto LAB_0034585d;
      }
    }
    local_d0._M_dataplus._M_p = (pointer)paVar11;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_d0,"given invalid arguments for CACHE mode.","");
    std::__cxx11::string::_M_assign((string *)&status->Error);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != paVar11) {
      operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
    }
    bVar3 = false;
  }
LAB_0034585d:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,
                    CONCAT71(local_b0.field_2._M_allocated_capacity._1_7_,
                             local_b0.field_2._M_local_buf[0]) + 1);
    return bVar3;
  }
  return bVar3;
}

Assistant:

bool cmSetCommand(std::vector<std::string> const& args,
                  cmExecutionStatus& status)
{
  if (args.empty()) {
    status.SetError("called with incorrect number of arguments");
    return false;
  }

  // watch for ENV signatures
  auto const& variable = args[0]; // VAR is always first
  if (cmHasLiteralPrefix(variable, "ENV{") && variable.size() > 5) {
    // what is the variable name
    auto const& varName = variable.substr(4, variable.size() - 5);
    std::string putEnvArg = varName + "=";

    // what is the current value if any
    std::string currValue;
    const bool currValueSet = cmSystemTools::GetEnv(varName, currValue);

    // will it be set to something, then set it
    if (args.size() > 1 && !args[1].empty()) {
      // but only if it is different from current value
      if (!currValueSet || currValue != args[1]) {
        putEnvArg += args[1];
        cmSystemTools::PutEnv(putEnvArg);
      }
      // if there's extra arguments, warn user
      // that they are ignored by this command.
      if (args.size() > 2) {
        std::string m = "Only the first value argument is used when setting "
                        "an environment variable.  Argument '" +
          args[2] + "' and later are unused.";
        status.GetMakefile().IssueMessage(MessageType::AUTHOR_WARNING, m);
      }
      return true;
    }

    // if it will be cleared, then clear it if it isn't already clear
    if (currValueSet) {
      cmSystemTools::PutEnv(putEnvArg);
    }
    return true;
  }

  // SET (VAR) // Removes the definition of VAR.
  if (args.size() == 1) {
    status.GetMakefile().RemoveDefinition(variable);
    return true;
  }
  // SET (VAR PARENT_SCOPE) // Removes the definition of VAR
  // in the parent scope.
  if (args.size() == 2 && args.back() == "PARENT_SCOPE") {
    status.GetMakefile().RaiseScope(variable, nullptr);
    return true;
  }

  // here are the remaining options
  //  SET (VAR value )
  //  SET (VAR value PARENT_SCOPE)
  //  SET (VAR CACHE TYPE "doc String" [FORCE])
  //  SET (VAR value CACHE TYPE "doc string" [FORCE])
  std::string value;  // optional
  bool cache = false; // optional
  bool force = false; // optional
  bool parentScope = false;
  cmStateEnums::CacheEntryType type =
    cmStateEnums::STRING;          // required if cache
  const char* docstring = nullptr; // required if cache

  unsigned int ignoreLastArgs = 0;
  // look for PARENT_SCOPE argument
  if (args.size() > 1 && args.back() == "PARENT_SCOPE") {
    parentScope = true;
    ignoreLastArgs++;
  } else {
    // look for FORCE argument
    if (args.size() > 4 && args.back() == "FORCE") {
      force = true;
      ignoreLastArgs++;
    }

    // check for cache signature
    if (args.size() > 3 &&
        args[args.size() - 3 - (force ? 1 : 0)] == "CACHE") {
      cache = true;
      ignoreLastArgs += 3;
    }
  }

  // collect any values into a single semi-colon separated value list
  value = cmJoin(cmMakeRange(args).advance(1).retreat(ignoreLastArgs), ";");

  if (parentScope) {
    status.GetMakefile().RaiseScope(variable, value.c_str());
    return true;
  }

  // we should be nice and try to catch some simple screwups if the last or
  // next to last args are CACHE then they screwed up.  If they used FORCE
  // without CACHE they screwed up
  if ((args.back() == "CACHE") ||
      (args.size() > 1 && args[args.size() - 2] == "CACHE") ||
      (force && !cache)) {
    status.SetError("given invalid arguments for CACHE mode.");
    return false;
  }

  if (cache) {
    std::string::size_type cacheStart = args.size() - 3 - (force ? 1 : 0);
    if (!cmState::StringToCacheEntryType(args[cacheStart + 1], type)) {
      std::string m = "implicitly converting '" + args[cacheStart + 1] +
        "' to 'STRING' type.";
      status.GetMakefile().IssueMessage(MessageType::AUTHOR_WARNING, m);
      // Setting this may not be required, since it's
      // initialized as a string. Keeping this here to
      // ensure that the type is actually converting to a string.
      type = cmStateEnums::STRING;
    }
    docstring = args[cacheStart + 2].c_str();
  }

  // see if this is already in the cache
  cmState* state = status.GetMakefile().GetState();
  cmValue existingValue = state->GetCacheEntryValue(variable);
  if (existingValue &&
      (state->GetCacheEntryType(variable) != cmStateEnums::UNINITIALIZED)) {
    // if the set is trying to CACHE the value but the value
    // is already in the cache and the type is not internal
    // then leave now without setting any definitions in the cache
    // or the makefile
    if (cache && type != cmStateEnums::INTERNAL && !force) {
      return true;
    }
  }

  // if it is meant to be in the cache then define it in the cache
  if (cache) {
    status.GetMakefile().AddCacheDefinition(variable, value, docstring, type,
                                            force);
  } else {
    // add the definition
    status.GetMakefile().AddDefinition(variable, value);
  }
  return true;
}